

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O1

char * google::protobuf::FastUInt64ToBufferLeft(uint64 u64,char *buffer)

{
  char *pcVar1;
  LogMessage *other;
  uint uVar2;
  uint uVar3;
  LogMessage local_60;
  LogFinisher local_21;
  
  if (u64 >> 0x20 == 0) {
    pcVar1 = FastUInt32ToBufferLeft((uint32)u64,buffer);
    return pcVar1;
  }
  pcVar1 = FastUInt64ToBufferLeft(u64 / 1000000000,buffer);
  uVar3 = (uint32)u64 + (int)(u64 / 1000000000) * -1000000000;
  if (999999999 < uVar3) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/stubs/strutil.cc"
               ,0x432);
    other = internal::LogMessage::operator<<(&local_60,"CHECK failed: (digits) < (100): ");
    internal::LogFinisher::operator=(&local_21,other);
    internal::LogMessage::~LogMessage(&local_60);
  }
  *(undefined2 *)pcVar1 = *(undefined2 *)(two_ASCII_digits + (ulong)(uVar3 / 10000000) * 2);
  uVar2 = uVar3 % 10000000 >> 5;
  *(undefined2 *)(pcVar1 + 2) = *(undefined2 *)(two_ASCII_digits + ((ulong)uVar2 / 0xc35) * 2);
  uVar3 = (uVar2 / 0xc35) * -100000 + uVar3 % 10000000;
  *(undefined2 *)(pcVar1 + 4) = *(undefined2 *)(two_ASCII_digits + ((ulong)uVar3 / 1000) * 2);
  uVar3 = uVar3 % 1000;
  *(undefined2 *)(pcVar1 + 6) = *(undefined2 *)(two_ASCII_digits + ((ulong)uVar3 / 10) * 2);
  pcVar1[8] = (char)(uVar3 / 10) * -10 + (char)uVar3 + '0';
  pcVar1[9] = '\0';
  return pcVar1 + 9;
}

Assistant:

char* FastUInt64ToBufferLeft(uint64 u64, char* buffer) {
  int digits;
  const char *ASCII_digits = nullptr;

  uint32 u = static_cast<uint32>(u64);
  if (u == u64) return FastUInt32ToBufferLeft(u, buffer);

  uint64 top_11_digits = u64 / 1000000000;
  buffer = FastUInt64ToBufferLeft(top_11_digits, buffer);
  u = u64 - (top_11_digits * 1000000000);

  digits = u / 10000000;  // 10,000,000
  GOOGLE_DCHECK_LT(digits, 100);
  ASCII_digits = two_ASCII_digits[digits];
  buffer[0] = ASCII_digits[0];
  buffer[1] = ASCII_digits[1];
  buffer += 2;
  u -= digits * 10000000;  // 10,000,000
  digits = u / 100000;  // 100,000
  ASCII_digits = two_ASCII_digits[digits];
  buffer[0] = ASCII_digits[0];
  buffer[1] = ASCII_digits[1];
  buffer += 2;
  u -= digits * 100000;  // 100,000
  digits = u / 1000;  // 1,000
  ASCII_digits = two_ASCII_digits[digits];
  buffer[0] = ASCII_digits[0];
  buffer[1] = ASCII_digits[1];
  buffer += 2;
  u -= digits * 1000;  // 1,000
  digits = u / 10;
  ASCII_digits = two_ASCII_digits[digits];
  buffer[0] = ASCII_digits[0];
  buffer[1] = ASCII_digits[1];
  buffer += 2;
  u -= digits * 10;
  digits = u;
  *buffer++ = '0' + digits;
  *buffer = 0;
  return buffer;
}